

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O2

void __thiscall roaring::Roaring::~Roaring(Roaring *this)

{
  if (((this->roaring).high_low_container.flags & 2) == 0) {
    roaring_bitmap_clear((roaring_bitmap_t *)this);
  }
  else {
    roaring_bitmap_free((roaring_bitmap_t *)((this->roaring).high_low_container.containers + -5));
  }
  return;
}

Assistant:

~Roaring() {
        if (!(roaring.high_low_container.flags & ROARING_FLAG_FROZEN)) {
            api::roaring_bitmap_clear(&roaring);
        } else {
            // The roaring member variable copies the `roaring_bitmap_t` and
            // nested `roaring_array_t` structures by value and is freed in the
            // constructor, however the underlying memory arena used for the
            // container data is not freed with it. Here we derive the arena
            // pointer from the second arena allocation in
            // `roaring_bitmap_frozen_view` and free it as well.
            roaring_bitmap_free(
                (roaring_bitmap_t *)((char *)
                                         roaring.high_low_container.containers -
                                     sizeof(roaring_bitmap_t)));
        }
    }